

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O3

void p_ere(parse *p,int stop)

{
  int *piVar1;
  size_t opnd;
  byte bVar2;
  size_t sVar3;
  long lVar4;
  re_guts *prVar5;
  bool bVar6;
  int from;
  int iVar7;
  ushort **ppuVar8;
  bool bVar9;
  long pos;
  sop opnd_00;
  sopno pos_00;
  char *pcVar10;
  char *pcVar11;
  sop op;
  char *pcVar12;
  long local_48;
  long local_40;
  
  pos = p->slen;
  pcVar12 = p->end;
  bVar9 = false;
  pcVar11 = p->next;
  while (pos_00 = pos, pcVar11 < pcVar12) {
    do {
      pos_00 = p->slen;
      if ((*pcVar11 == 0x7c) || (*pcVar11 == stop)) goto LAB_00104064;
      pcVar10 = (char *)((byte *)pcVar11 + 1);
      p->next = pcVar10;
      bVar2 = *pcVar11;
      if (0x3e < bVar2) {
        if (bVar2 < 0x5e) {
          if (bVar2 == 0x3f) goto switchD_00103b8f_caseD_2a;
          if (bVar2 == 0x5b) {
            p_bracket(p);
            goto LAB_00103d35;
          }
          if (bVar2 != 0x5c) goto switchD_00103b8f_caseD_25;
          if (pcVar12 <= pcVar10) {
            if (p->error == 0) {
              p->error = 5;
            }
            pcVar10 = nuls;
            p->end = nuls;
          }
          p->next = (char *)((byte *)pcVar10 + 1);
          bVar2 = *pcVar10;
LAB_00103d2d:
          ordinary(p,(int)(char)bVar2);
          goto LAB_00103d35;
        }
        if (bVar2 != 0x5e) {
          if (bVar2 == 0x7b) {
            if ((pcVar10 < pcVar12) &&
               (ppuVar8 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar8 + (long)*pcVar10 * 2 + 1) & 8) != 0)) {
              if (p->error == 0) {
                p->error = 0xd;
              }
              p->next = nuls;
              p->end = nuls;
            }
          }
          else if (bVar2 == 0x7c) {
            if (p->error == 0) {
              p->error = 0xe;
            }
            goto LAB_00103cda;
          }
          goto switchD_00103b8f_caseD_25;
        }
        bVar6 = false;
        doemit(p,0xc000000,0);
        prVar5 = p->g;
        piVar1 = &prVar5->iflags;
        *piVar1 = *piVar1 | 1;
        piVar1 = &prVar5->nbol;
        *piVar1 = *piVar1 + 1;
        goto LAB_00103d38;
      }
      switch(bVar2) {
      case 0x24:
        doemit(p,0x10000000,0);
        prVar5 = p->g;
        piVar1 = &prVar5->iflags;
        *piVar1 = *piVar1 | 2;
        piVar1 = &prVar5->neol;
        *piVar1 = *piVar1 + 1;
        break;
      default:
switchD_00103b8f_caseD_25:
        goto LAB_00103d2d;
      case 0x28:
        if (pcVar12 <= pcVar10) {
          if (p->error == 0) {
            p->error = 8;
          }
          p->next = nuls;
          p->end = nuls;
        }
        sVar3 = p->g->nsub;
        opnd = sVar3 + 1;
        p->g->nsub = opnd;
        if ((long)opnd < 10) {
          p->pbegin[sVar3 + 1] = pos_00;
        }
        doemit(p,0x34000000,opnd);
        if ((p->end <= p->next) || (*p->next != ')')) {
          p_ere(p,0x29);
        }
        if (((long)opnd < 10) && (lVar4 = p->slen, p->pend[sVar3 + 1] = lVar4, lVar4 == 0)) {
          __assert_fail("p->pend[subno] != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                        ,0x11f,"void p_ere_exp()");
        }
        doemit(p,0x38000000,opnd);
        pcVar11 = p->next;
        if (pcVar11 < p->end) {
          p->next = pcVar11 + 1;
          bVar6 = true;
          if (*pcVar11 == ')') goto LAB_00103d38;
        }
        if (p->error == 0) {
          p->error = 8;
        }
        goto LAB_00103cda;
      case 0x2a:
      case 0x2b:
switchD_00103b8f_caseD_2a:
        if (p->error == 0) {
          p->error = 0xd;
        }
LAB_00103cda:
        p->next = nuls;
        p->end = nuls;
        break;
      case 0x2e:
        if ((p->g->cflags & 8) == 0) {
          doemit(p,0x14000000,0);
        }
        else {
          nonnewline(p);
        }
      }
LAB_00103d35:
      bVar6 = true;
LAB_00103d38:
      pcVar11 = p->next;
      pcVar12 = p->end;
      if ((pcVar11 < pcVar12) &&
         (((bVar2 = *pcVar11, bVar2 - 0x2a < 2 || (bVar2 == 0x3f)) ||
          ((bVar2 == 0x7b &&
           (((byte *)pcVar11 + 1 < pcVar12 &&
            (ppuVar8 = __ctype_b_loc(),
            (*(byte *)((long)*ppuVar8 + (long)(char)((byte *)pcVar11)[1] * 2 + 1) & 8) != 0))))))))
      {
        p->next = (char *)((byte *)pcVar11 + 1);
        if (!bVar6) {
          if (p->error == 0) {
            p->error = 0xd;
          }
          p->next = nuls;
          p->end = nuls;
        }
        if (bVar2 < 0x3f) {
          if (bVar2 == 0x2a) {
            doinsert(p,0x24000000,(p->slen - pos_00) + 1,pos_00);
            doemit(p,0x28000000,p->slen - pos_00);
            doinsert(p,0x2c000000,(p->slen - pos_00) + 1,pos_00);
            opnd_00 = p->slen - pos_00;
            op = 0x30000000;
          }
          else {
            if (bVar2 != 0x2b) goto LAB_00103f9f;
            doinsert(p,0x24000000,(p->slen - pos_00) + 1,pos_00);
            opnd_00 = p->slen - pos_00;
            op = 0x28000000;
          }
LAB_00103f97:
          doemit(p,op,opnd_00);
        }
        else {
          if (bVar2 == 0x3f) {
            doinsert(p,0x3c000000,(p->slen - pos_00) + 1,pos_00);
            doemit(p,0x40000000,p->slen - pos_00);
            dofwd(p,pos_00,p->slen - pos_00);
            doemit(p,0x44000000,0);
            if (p->error == 0) {
              p->strip[p->slen + -1] = (ulong)((uint)p->strip[p->slen + -1] & 0x7c000000) + 1;
            }
            op = 0x48000000;
            opnd_00 = 2;
            goto LAB_00103f97;
          }
          if (bVar2 == 0x7b) {
            from = p_count(p);
            pcVar11 = p->next;
            iVar7 = from;
            if ((pcVar11 < p->end) && (*pcVar11 == ',')) {
              p->next = pcVar11 + 1;
              ppuVar8 = __ctype_b_loc();
              iVar7 = 0x100;
              if (((*(byte *)((long)*ppuVar8 + (long)pcVar11[1] * 2 + 1) & 8) != 0) &&
                 (iVar7 = p_count(p), iVar7 < from)) {
                if (p->error == 0) {
                  p->error = 10;
                }
                p->next = nuls;
                p->end = nuls;
              }
            }
            repeat(p,pos_00,from,iVar7);
            pcVar11 = p->next;
            if (pcVar11 < p->end) {
              if (*pcVar11 == '}') {
                p->next = pcVar11 + 1;
                goto LAB_00103f9f;
              }
              do {
                pcVar11 = pcVar11 + 1;
                p->next = pcVar11;
                if (pcVar11 == p->end) goto LAB_0010401d;
              } while (*pcVar11 != '}');
              if (p->error == 0) {
                iVar7 = 10;
                goto LAB_00104029;
              }
            }
            else {
LAB_0010401d:
              if (p->error == 0) {
                iVar7 = 9;
LAB_00104029:
                p->error = iVar7;
              }
            }
            p->next = nuls;
            p->end = nuls;
          }
        }
LAB_00103f9f:
        pcVar11 = p->next;
        pcVar12 = p->end;
        if (pcVar11 < pcVar12) {
          bVar2 = *pcVar11;
          if (bVar2 == 0x7b) {
            if (((byte *)pcVar11 + 1 < pcVar12) &&
               (ppuVar8 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar8 + (long)(char)((byte *)pcVar11)[1] * 2 + 1) & 8) != 0)) {
LAB_00104040:
              if (p->error == 0) {
                p->error = 0xd;
              }
              pcVar12 = nuls;
              p->next = nuls;
              p->end = nuls;
              pcVar11 = nuls;
              break;
            }
          }
          else if ((bVar2 - 0x2a < 2) || (bVar2 == 0x3f)) goto LAB_00104040;
        }
      }
    } while (pcVar11 < pcVar12);
    pos_00 = p->slen;
LAB_00104064:
    if (pos_00 - pos == 0) break;
    if ((pcVar12 <= pcVar11) || (*pcVar11 != 0x7c)) goto LAB_00104143;
    p->next = (char *)((byte *)pcVar11 + 1);
    if (!bVar9) {
      doinsert(p,0x3c000000,(pos_00 - pos) + 1,pos);
      pos_00 = p->slen;
      local_40 = pos;
      local_48 = pos;
    }
    doemit(p,0x40000000,pos_00 - local_40);
    local_40 = p->slen + -1;
    dofwd(p,local_48,p->slen - local_48);
    local_48 = p->slen;
    doemit(p,0x44000000,0);
    pos = p->slen;
    pcVar12 = p->end;
    bVar9 = true;
    pcVar11 = p->next;
  }
  if (p->error == 0) {
    p->error = 0xe;
  }
  pcVar11 = nuls;
  p->next = nuls;
  p->end = nuls;
  pcVar12 = nuls;
LAB_00104143:
  if (bVar9) {
    dofwd(p,local_48,pos_00 - local_48);
    doemit(p,0x48000000,p->slen - local_40);
    pcVar11 = p->next;
    pcVar12 = p->end;
  }
  if ((pcVar11 < pcVar12) && (*pcVar11 != stop)) {
    __assert_fail("!MORE() || SEE(stop)",
                  "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                  ,0xfe,"void p_ere()");
  }
  return;
}

Assistant:

static void
p_ere(p, stop)
struct parse *p;
int stop;			/* character this ERE should end at */
{
	char c;
	sopno prevback;
	sopno prevfwd;
	sopno conc;
	int first = 1;		/* is this the first alternative? */

	for (;;) {
		/* do a bunch of concatenated expressions */
		conc = HERE();
		while (MORE() && (c = PEEK()) != '|' && c != stop)
			p_ere_exp(p);
		REQUIRE(HERE() != conc, REG_EMPTY);	/* require nonempty */

		if (!EAT('|'))
			break;		/* NOTE BREAK OUT */

		if (first) {
			INSERT(OCH_, conc);	/* offset is wrong */
			prevfwd = conc;
			prevback = conc;
			first = 0;
		}
		ASTERN(OOR1, prevback);
		prevback = THERE();
		AHEAD(prevfwd);			/* fix previous offset */
		prevfwd = HERE();
		EMIT(OOR2, 0);			/* offset is very wrong */
	}

	if (!first) {		/* tail-end fixups */
		AHEAD(prevfwd);
		ASTERN(O_CH, prevback);
	}

	assert(!MORE() || SEE(stop));
}